

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_function::dump(statement_function *this,ostream *o)

{
  pointer pbVar1;
  _Elt_pointer ppsVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  statement_base **ptr;
  _Elt_pointer ppsVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer pbVar7;
  _Elt_pointer ppsVar8;
  _Map_pointer pppsVar9;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginFunction: ID = \"",0x17);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->mName)._M_dataplus._M_p,(this->mName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  if (this->mOverride == true) {
    pcVar5 = ", Override = True >\n";
    lVar4 = 0x14;
  }
  else {
    pcVar5 = ", Override = False >\n";
    lVar4 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(o,"< FunctionArgs = {",0x12);
  pbVar1 = (this->mArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (this->mArgs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"< ID = \"",8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" >",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"} >\n< Body >\n",0xd);
  ppsVar6 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar2 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar6 != ppsVar2) {
    ppsVar8 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar9 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar6)->_vptr_statement_base[5])(*ppsVar6,o);
      ppsVar6 = ppsVar6 + 1;
      if (ppsVar6 == ppsVar8) {
        ppsVar6 = pppsVar9[1];
        pppsVar9 = pppsVar9 + 1;
        ppsVar8 = ppsVar6 + 0x40;
      }
    } while (ppsVar6 != ppsVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndFunction >\n",0x10);
  return;
}

Assistant:

void statement_function::dump(std::ostream &o) const
	{
		o << "< BeginFunction: ID = \"" << mName << "\"";
		if (mOverride)
			o << ", Override = True >\n";
		else
			o << ", Override = False >\n";
		o << "< FunctionArgs = {";
		for (auto &name: mArgs)
			o << "< ID = \"" << name << "\" >";
		o << "} >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndFunction >\n";
	}